

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_one_block(working_state *state,JCOEFPTR block,int last_dc_val,c_derived_tbl *dctbl,
                        c_derived_tbl *actbl)

{
  size_t *psVar1;
  byte bVar2;
  bit_buf_type bVar3;
  byte bVar4;
  byte bVar10;
  int iVar5;
  uint uVar6;
  boolean bVar7;
  long lVar8;
  anon_union_8_2_c960f3a9_for_put_buffer aVar9;
  byte bVar11;
  byte bVar12;
  int iVar13;
  byte bVar14;
  byte bVar15;
  byte bVar19;
  uint uVar16;
  byte *pbVar17;
  ulong uVar18;
  byte *pbVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  byte *pbVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  int iVar31;
  JOCTET *__src;
  bool bVar32;
  bool bVar33;
  JOCTET _buffer [512];
  
  iVar5 = (state->cur).free_bits;
  uVar18 = state->free_in_buffer;
  if (uVar18 < 0x200) {
    pbVar20 = _buffer;
  }
  else {
    pbVar20 = state->next_output_byte;
  }
  bVar3 = (state->cur).put_buffer.c;
  iVar13 = *block - last_dc_val;
  iVar31 = -iVar13;
  if (0 < iVar13) {
    iVar31 = iVar13;
  }
  bVar2 = ""[iVar31];
  uVar29 = dctbl->ehufco[bVar2] << (bVar2 & 0x1f) |
           ~(uint)(-1L << (bVar2 & 0x3f)) & (iVar13 >> 0x1f) + iVar13;
  iVar13 = (int)dctbl->ehufsi[bVar2] + (uint)bVar2;
  iVar31 = iVar5 - iVar13;
  uVar28 = (ulong)(int)uVar29;
  if (iVar31 < 0) {
    uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | bVar3 << ((byte)iVar5 & 0x3f);
    bVar14 = (byte)(uVar26 >> 0x38);
    *pbVar20 = bVar14;
    bVar4 = (byte)uVar26;
    bVar10 = (byte)(uVar26 >> 8);
    bVar12 = (byte)(uVar26 >> 0x18);
    bVar23 = (byte)(uVar26 >> 0x20);
    bVar22 = (byte)(uVar26 >> 0x28);
    bVar11 = (byte)(uVar26 >> 0x30);
    bVar2 = (byte)(uVar26 >> 0x10);
    if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
      pbVar20[1] = bVar11;
      pbVar20[2] = bVar22;
      pbVar20[3] = bVar23;
      pbVar20[4] = bVar12;
      pbVar20[5] = bVar2;
      pbVar20[6] = bVar10;
      pbVar20[7] = bVar4;
      pbVar20 = pbVar20 + 8;
    }
    else {
      pbVar20[1] = 0;
      uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
      pbVar17 = pbVar20 + 1;
      if (bVar14 == 0xff) {
        pbVar17 = pbVar20 + 2;
      }
      pbVar20[uVar30 + 1] = bVar11;
      pbVar20[uVar30 + 2] = 0;
      uVar30 = ~uVar26;
      bVar32 = (uVar30 & 0xff000000000000) == 0;
      pbVar17[(ulong)bVar32 + 1] = bVar22;
      pbVar17[(ulong)bVar32 + 2] = 0;
      pbVar20 = pbVar17 + (ulong)bVar32 + 3;
      pbVar27 = pbVar17 + (ulong)bVar32 + 4;
      if ((uVar30 & 0xff0000000000) != 0) {
        pbVar27 = pbVar20;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
      }
      *pbVar20 = bVar23;
      *pbVar27 = 0;
      bVar32 = (uVar30 & 0xff00000000) == 0;
      pbVar20[(ulong)bVar32 + 1] = bVar12;
      uVar29 = (uint)uVar26 & 0xff000000;
      pbVar17 = pbVar20 + (ulong)bVar32 + 2;
      if (uVar29 == 0xff000000) {
        pbVar17 = pbVar20 + (ulong)bVar32 + 3;
      }
      pbVar20[(ulong)bVar32 + 2] = 0;
      *pbVar17 = bVar2;
      pbVar27 = pbVar20 + (ulong)bVar32 + 4;
      if (uVar29 != 0xff000000) {
        pbVar27 = pbVar20 + (ulong)bVar32 + 3;
      }
      *pbVar27 = 0;
      uVar29 = ~(uint)uVar26;
      bVar32 = (uVar29 & 0xff0000) == 0;
      pbVar17[(ulong)bVar32 + 1] = bVar10;
      pbVar17[(ulong)bVar32 + 2] = 0;
      bVar33 = (uVar29 & 0xff00) == 0;
      pbVar20 = pbVar17 + (ulong)bVar32 + 2;
      if (bVar33) {
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
      }
      *pbVar20 = bVar4;
      pbVar27 = pbVar17 + (ulong)bVar32 + 4;
      if (!bVar33) {
        pbVar27 = pbVar17 + (ulong)bVar32 + 3;
      }
      *pbVar27 = 0;
      pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
    }
    iVar31 = iVar31 + 0x40;
  }
  else {
    uVar28 = uVar28 | bVar3 << ((byte)iVar13 & 0x3f);
  }
  uVar29 = (uint)block[1];
  if (block[1] == 0) {
    uVar29 = 0x10;
  }
  else {
    uVar6 = -uVar29;
    if (0 < (int)uVar29) {
      uVar6 = uVar29;
    }
    bVar2 = ""[uVar6];
    uVar29 = actbl->ehufco[bVar2] << (bVar2 & 0x1f) |
             ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar29 >> 0x1f) + uVar29;
    iVar13 = (int)actbl->ehufsi[bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar29;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar29 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[8];
  if (block[8] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x10];
  if (block[0x10] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar22 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar22;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar22;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[9];
  if (block[9] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[2];
  if (block[2] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar22 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar22;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar22;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[3];
  if (block[3] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[10];
  if (block[10] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x11];
  if (block[0x11] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar22 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar22;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar22;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x18];
  if (block[0x18] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x20];
  if (block[0x20] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x19];
  if (block[0x19] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar22 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar22;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar22;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x12];
  if (block[0x12] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar22 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar22;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar22;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0xb];
  if (block[0xb] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar22 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar22;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar22;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[4];
  if (block[4] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar22 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar22;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar22;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[5];
  if (block[5] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar26 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar14 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar14;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar23 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar22 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar22;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar23;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar14 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar22;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar12;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar23;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0xc];
  if (block[0xc] == 0) {
    uVar26 = (ulong)(uVar29 + 0x10);
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar6 = actbl->ehufco[(ulong)uVar29 + (ulong)bVar2] << (bVar2 & 0x1f) |
            ~(uint)(-1L << (bVar2 & 0x3f)) & ((int)uVar6 >> 0x1f) + uVar6;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar29 + (ulong)bVar2] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    uVar30 = (ulong)(int)uVar6;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar6 >> (-(char)iVar5 & 0x1fU)) | uVar28 << ((byte)iVar31 & 0x3f);
      bVar22 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar14 = (byte)(uVar28 >> 0x20);
      bVar23 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar26 + 1] = bVar11;
        pbVar20[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar32 = (uVar26 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar26 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar5 + 0x40;
    }
    else {
      uVar30 = uVar30 | uVar28 << ((byte)iVar13 & 0x3f);
      iVar31 = iVar5;
    }
    uVar26 = 0;
    uVar28 = uVar30;
  }
  uVar29 = (uint)block[0x13];
  if (block[0x13] == 0) {
    uVar29 = (int)uVar26 + 0x10;
  }
  else {
    uVar6 = -uVar29;
    if (0 < (int)uVar29) {
      uVar6 = uVar29;
    }
    bVar2 = ""[uVar6];
    while (bVar4 = (byte)iVar31, 0xff < (uint)uVar26) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar28 = uVar28 << (bVar4 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar26 = uVar6 | uVar28;
        bVar11 = (byte)(uVar28 >> 0x38);
        *pbVar20 = bVar11;
        bVar15 = (byte)uVar26;
        bVar19 = (byte)(uVar26 >> 8);
        bVar21 = (byte)(uVar28 >> 0x20);
        bVar12 = (byte)(uVar28 >> 0x28);
        bVar23 = (byte)(uVar28 >> 0x30);
        bVar22 = (byte)(uVar28 >> 0x10);
        bVar10 = (byte)(uVar28 >> 0x18);
        bVar14 = (byte)(uVar6 >> 0x10);
        bVar4 = (byte)(uVar6 >> 0x18);
        if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
          pbVar20[1] = bVar23;
          pbVar20[2] = bVar12;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar19;
          pbVar20[7] = bVar15;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar11 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar26 + 1] = bVar23;
          pbVar20[uVar26 + 2] = 0;
          uVar26 = ~uVar28;
          bVar32 = (uVar26 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar12;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar26 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar26 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar24 = (uVar6 | (uint)uVar28) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar24 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar24 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar6 = ~(uVar6 | (uint)uVar28);
          bVar32 = (uVar6 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar6 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar15;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar15 == 0xff) + 1;
        }
        iVar31 = iVar31 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
      }
      uVar26 = 0;
    }
    uVar29 = actbl->ehufco[uVar26 + bVar2] << (bVar2 & 0x1f) |
             ((int)uVar29 >> 0x1f) + uVar29 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[uVar26 + bVar2] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar26 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar28 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar28 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar14 = (byte)(uVar28 >> 0x20);
      bVar23 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x1a];
  if (block[0x1a] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar28 = uVar28 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar26 = uVar16 | uVar28;
        bVar11 = (byte)(uVar28 >> 0x38);
        *pbVar20 = bVar11;
        bVar15 = (byte)uVar26;
        bVar19 = (byte)(uVar26 >> 8);
        bVar21 = (byte)(uVar28 >> 0x20);
        bVar12 = (byte)(uVar28 >> 0x28);
        bVar23 = (byte)(uVar28 >> 0x30);
        bVar22 = (byte)(uVar28 >> 0x10);
        bVar10 = (byte)(uVar28 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
          pbVar20[1] = bVar23;
          pbVar20[2] = bVar12;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar19;
          pbVar20[7] = bVar15;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar11 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar26 + 1] = bVar23;
          pbVar20[uVar26 + 2] = 0;
          uVar26 = ~uVar28;
          bVar32 = (uVar26 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar12;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar26 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar26 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar28) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar28);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar15;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar15 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar26 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar28 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar28 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar14 = (byte)(uVar28 >> 0x20);
      bVar23 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar28;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
    uVar28 = uVar26;
  }
  uVar6 = (uint)block[0x21];
  if (block[0x21] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x28];
  if (block[0x28] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x30];
  if (block[0x30] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x29];
  if (block[0x29] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x22];
  if (block[0x22] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x1b];
  if (block[0x1b] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x14];
  if (block[0x14] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0xd];
  if (block[0xd] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[6];
  if (block[6] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[7];
  if (block[7] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0xe];
  if (block[0xe] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x15];
  if (block[0x15] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x1c];
  if (block[0x1c] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x23];
  if (block[0x23] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x2a];
  if (block[0x2a] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x31];
  if (block[0x31] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x38];
  if (block[0x38] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x39];
  if (block[0x39] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x32];
  if (block[0x32] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x2b];
  if (block[0x2b] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x24];
  if (block[0x24] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x1d];
  if (block[0x1d] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x16];
  if (block[0x16] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0xf];
  if (block[0xf] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x17];
  if (block[0x17] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x1e];
  if (block[0x1e] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x25];
  if (block[0x25] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x2c];
  if (block[0x2c] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x33];
  if (block[0x33] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x3a];
  if (block[0x3a] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x3b];
  if (block[0x3b] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x34];
  if (block[0x34] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x2d];
  if (block[0x2d] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x26];
  if (block[0x26] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x1f];
  if (block[0x1f] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x27];
  if (block[0x27] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x2e];
  if (block[0x2e] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x35];
  if (block[0x35] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar11 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x3c];
  if (block[0x3c] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar12 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar11 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar12;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar30 + 1] = bVar11;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if ((uVar30 & 0xff0000000000) != 0) {
          pbVar27 = pbVar20;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        }
        *pbVar20 = bVar14;
        *pbVar27 = 0;
        bVar32 = (uVar30 & 0xff00000000) == 0;
        pbVar20[(ulong)bVar32 + 1] = bVar12;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        pbVar20[(ulong)bVar32 + 2] = 0;
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x3d];
  if (block[0x3d] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar15 = (byte)(uVar26 >> 0x28);
        bVar19 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar19;
          pbVar20[2] = bVar15;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar19;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar15;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar11 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar11;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar22 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar12 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar12;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar22;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar11 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[1] = 0;
        pbVar20[uVar30 + 1] = bVar12;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar30 & 0xff0000000000) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar14;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        bVar32 = (uVar30 & 0xff00000000) == 0;
        *pbVar27 = 0;
        pbVar20[(ulong)bVar32 + 1] = bVar22;
        pbVar20[(ulong)bVar32 + 2] = 0;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x36];
  if (block[0x36] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar11 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar11;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar22 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar12 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar12;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar22;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar11 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[1] = 0;
        pbVar20[uVar30 + 1] = bVar12;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar30 & 0xff0000000000) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar14;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        bVar32 = (uVar30 & 0xff00000000) == 0;
        *pbVar27 = 0;
        pbVar20[(ulong)bVar32 + 1] = bVar22;
        pbVar20[(ulong)bVar32 + 2] = 0;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x2f];
  if (block[0x2f] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar11 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar11;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar22 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar23 = (byte)(uVar26 >> 0x28);
      bVar12 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar12;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar22;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar11 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[1] = 0;
        pbVar20[uVar30 + 1] = bVar12;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar30 & 0xff0000000000) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar14;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        bVar32 = (uVar30 & 0xff00000000) == 0;
        *pbVar27 = 0;
        pbVar20[(ulong)bVar32 + 1] = bVar22;
        pbVar20[(ulong)bVar32 + 2] = 0;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x37];
  if (block[0x37] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar26 = uVar28;
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar26 = uVar26 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar28 = uVar16 | uVar26;
        bVar12 = (byte)(uVar26 >> 0x38);
        *pbVar20 = bVar12;
        bVar11 = (byte)uVar28;
        bVar23 = (byte)(uVar28 >> 8);
        bVar21 = (byte)(uVar26 >> 0x20);
        bVar19 = (byte)(uVar26 >> 0x28);
        bVar15 = (byte)(uVar26 >> 0x30);
        bVar22 = (byte)(uVar26 >> 0x10);
        bVar10 = (byte)(uVar26 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
          pbVar20[1] = bVar15;
          pbVar20[2] = bVar19;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar23;
          pbVar20[7] = bVar11;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar28 = (ulong)(uVar26 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar12 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar28 + 1] = bVar15;
          pbVar20[uVar28 + 2] = 0;
          uVar28 = ~uVar26;
          bVar32 = (uVar28 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar28 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar28 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar26) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar26);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar11;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar11 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar26 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    uVar28 = (ulong)(int)uVar29;
    if (iVar31 < 0) {
      uVar26 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar26 << (bVar4 & 0x3f);
      bVar11 = (byte)(uVar26 >> 0x38);
      *pbVar20 = bVar11;
      bVar4 = (byte)uVar26;
      bVar10 = (byte)(uVar26 >> 8);
      bVar22 = (byte)(uVar26 >> 0x18);
      bVar14 = (byte)(uVar26 >> 0x20);
      bVar12 = (byte)(uVar26 >> 0x28);
      bVar23 = (byte)(uVar26 >> 0x30);
      bVar2 = (byte)(uVar26 >> 0x10);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar12;
        pbVar20[3] = bVar14;
        pbVar20[4] = bVar22;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        uVar30 = (ulong)(uVar26 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar11 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[1] = 0;
        pbVar20[uVar30 + 1] = bVar23;
        pbVar20[uVar30 + 2] = 0;
        uVar30 = ~uVar26;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar12;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar30 & 0xff0000000000) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar14;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        bVar32 = (uVar30 & 0xff00000000) == 0;
        *pbVar27 = 0;
        pbVar20[(ulong)bVar32 + 1] = bVar22;
        pbVar20[(ulong)bVar32 + 2] = 0;
        uVar29 = (uint)uVar26 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar29 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar29 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uint)uVar26;
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar5 & 0x3f);
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x3e];
  if (block[0x3e] == 0) {
    uVar29 = uVar29 + 0x10;
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar28 = uVar28 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar26 = uVar16 | uVar28;
        bVar11 = (byte)(uVar28 >> 0x38);
        *pbVar20 = bVar11;
        bVar15 = (byte)uVar26;
        bVar19 = (byte)(uVar26 >> 8);
        bVar21 = (byte)(uVar28 >> 0x20);
        bVar23 = (byte)(uVar28 >> 0x28);
        bVar12 = (byte)(uVar28 >> 0x30);
        bVar22 = (byte)(uVar28 >> 0x10);
        bVar10 = (byte)(uVar28 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
          pbVar20[1] = bVar12;
          pbVar20[2] = bVar23;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar19;
          pbVar20[7] = bVar15;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar11 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar26 + 1] = bVar12;
          pbVar20[uVar26 + 2] = 0;
          uVar26 = ~uVar28;
          bVar32 = (uVar26 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar26 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar26 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar28) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar28);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar15;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar15 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar5 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar31 = iVar31 - iVar5;
    if (iVar31 < 0) {
      uVar28 = (long)((int)uVar29 >> (-(char)iVar31 & 0x1fU)) | uVar28 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar14 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar11 = (byte)(uVar28 >> 0x28);
      bVar23 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar23;
        pbVar20[2] = bVar11;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar14;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[1] = 0;
        pbVar20[uVar26 + 1] = bVar23;
        pbVar20[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar32 = (uVar26 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar26 & 0xff0000000000) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar12;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        bVar32 = (uVar26 & 0xff00000000) == 0;
        *pbVar27 = 0;
        pbVar20[(ulong)bVar32 + 1] = bVar14;
        pbVar20[(ulong)bVar32 + 2] = 0;
        uVar6 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar6 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar6 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar6 = ~(uint)uVar28;
        bVar32 = (uVar6 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar6 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar31 = iVar31 + 0x40;
      uVar28 = (ulong)(int)uVar29;
    }
    else {
      uVar28 = uVar28 << ((byte)iVar5 & 0x3f) | (long)(int)uVar29;
    }
    uVar29 = 0;
  }
  uVar6 = (uint)block[0x3f];
  if (block[0x3f] == 0) {
    iVar5 = iVar31 - actbl->ehufsi[0];
    if (iVar5 < 0) {
      uVar28 = uVar28 << ((byte)iVar31 & 0x3f);
      uVar29 = actbl->ehufco[0] >> (-(char)iVar5 & 0x1fU);
      uVar26 = uVar29 | uVar28;
      bVar23 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar23;
      bVar22 = (byte)uVar26;
      bVar11 = (byte)(uVar26 >> 8);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar15 = (byte)(uVar28 >> 0x28);
      bVar12 = (byte)(uVar28 >> 0x30);
      bVar14 = (byte)(uVar28 >> 0x10);
      bVar4 = (byte)(uVar28 >> 0x18);
      bVar10 = (byte)(uVar29 >> 0x10);
      bVar2 = (byte)(uVar29 >> 0x18);
      if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
        pbVar20[1] = bVar12;
        pbVar20[2] = bVar15;
        pbVar20[3] = bVar19;
        pbVar20[4] = bVar2 | bVar4;
        pbVar20[5] = bVar10 | bVar14;
        pbVar20[6] = bVar11;
        pbVar20[7] = bVar22;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar23 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar26 + 1] = bVar12;
        uVar30 = ~uVar28;
        bVar32 = (uVar30 & 0xff000000000000) == 0;
        pbVar20[uVar26 + 2] = 0;
        pbVar17[(ulong)bVar32 + 1] = bVar15;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar30 & 0xff0000000000) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar19;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        bVar32 = (uVar30 & 0xff00000000) == 0;
        *pbVar27 = 0;
        pbVar20[(ulong)bVar32 + 1] = bVar2 | bVar4;
        pbVar20[(ulong)bVar32 + 2] = 0;
        uVar6 = (uVar29 | (uint)uVar28) & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar6 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar17 = bVar10 | bVar14;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar6 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar29 = ~(uVar29 | (uint)uVar28);
        bVar32 = (uVar29 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar11;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar22;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar22 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      aVar9.c._4_4_ = 0;
      aVar9.c._0_4_ = actbl->ehufco[0];
    }
    else {
      aVar9.c = uVar28 << (actbl->ehufsi[0] & 0x3fU) | (ulong)actbl->ehufco[0];
    }
  }
  else {
    uVar24 = -uVar6;
    if (0 < (int)uVar6) {
      uVar24 = uVar6;
    }
    bVar2 = ""[uVar24];
    uVar24 = uVar29;
    while (bVar4 = (byte)iVar31, 0xff < (int)uVar24) {
      iVar31 = iVar31 - actbl->ehufsi[0xf0];
      if (iVar31 < 0) {
        uVar28 = uVar28 << (bVar4 & 0x3f);
        uVar16 = actbl->ehufco[0xf0] >> (-(char)iVar31 & 0x1fU);
        uVar26 = uVar16 | uVar28;
        bVar11 = (byte)(uVar28 >> 0x38);
        *pbVar20 = bVar11;
        bVar15 = (byte)uVar26;
        bVar19 = (byte)(uVar26 >> 8);
        bVar21 = (byte)(uVar28 >> 0x20);
        bVar23 = (byte)(uVar28 >> 0x28);
        bVar12 = (byte)(uVar28 >> 0x30);
        bVar22 = (byte)(uVar28 >> 0x10);
        bVar10 = (byte)(uVar28 >> 0x18);
        bVar14 = (byte)(uVar16 >> 0x10);
        bVar4 = (byte)(uVar16 >> 0x18);
        if ((uVar26 & 0x8080808080808080 & 0xfefefefefefefefe - uVar26) == 0) {
          pbVar20[1] = bVar12;
          pbVar20[2] = bVar23;
          pbVar20[3] = bVar21;
          pbVar20[4] = bVar4 | bVar10;
          pbVar20[5] = bVar14 | bVar22;
          pbVar20[6] = bVar19;
          pbVar20[7] = bVar15;
          pbVar20 = pbVar20 + 8;
        }
        else {
          pbVar20[1] = 0;
          uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar17 = pbVar20 + 1;
          if (bVar11 == 0xff) {
            pbVar17 = pbVar20 + 2;
          }
          pbVar20[uVar26 + 1] = bVar12;
          pbVar20[uVar26 + 2] = 0;
          uVar26 = ~uVar28;
          bVar32 = (uVar26 & 0xff000000000000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar23;
          pbVar17[(ulong)bVar32 + 2] = 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if ((uVar26 & 0xff0000000000) != 0) {
            pbVar27 = pbVar20;
            pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          }
          *pbVar20 = bVar21;
          *pbVar27 = 0;
          bVar32 = (uVar26 & 0xff00000000) == 0;
          pbVar20[(ulong)bVar32 + 1] = bVar4 | bVar10;
          uVar25 = (uVar16 | (uint)uVar28) & 0xff000000;
          pbVar17 = pbVar20 + (ulong)bVar32 + 2;
          if (uVar25 == 0xff000000) {
            pbVar17 = pbVar20 + (ulong)bVar32 + 3;
          }
          pbVar20[(ulong)bVar32 + 2] = 0;
          *pbVar17 = bVar14 | bVar22;
          pbVar27 = pbVar20 + (ulong)bVar32 + 4;
          if (uVar25 != 0xff000000) {
            pbVar27 = pbVar20 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          uVar16 = ~(uVar16 | (uint)uVar28);
          bVar32 = (uVar16 & 0xff0000) == 0;
          pbVar17[(ulong)bVar32 + 1] = bVar19;
          pbVar17[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar16 & 0xff00) == 0;
          pbVar20 = pbVar17 + (ulong)bVar32 + 2;
          if (bVar33) {
            pbVar20 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar20 = bVar15;
          pbVar27 = pbVar17 + (ulong)bVar32 + 4;
          if (!bVar33) {
            pbVar27 = pbVar17 + (ulong)bVar32 + 3;
          }
          *pbVar27 = 0;
          pbVar20 = pbVar20 + (ulong)(bVar15 == 0xff) + 1;
        }
        uVar24 = uVar24 - 0x100;
        iVar31 = iVar31 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar24 = uVar24 - 0x100;
      }
    }
    lVar8 = (ulong)(uVar29 & 0xff) + (ulong)bVar2;
    uVar29 = actbl->ehufco[lVar8] << (bVar2 & 0x1f) |
             ((int)uVar6 >> 0x1f) + uVar6 & ~(uint)(-1L << (bVar2 & 0x3f));
    iVar13 = (int)actbl->ehufsi[lVar8] + (uint)bVar2;
    iVar5 = iVar31 - iVar13;
    if (iVar5 < 0) {
      uVar28 = (long)((int)uVar29 >> (-(char)iVar5 & 0x1fU)) | uVar28 << (bVar4 & 0x3f);
      bVar22 = (byte)(uVar28 >> 0x38);
      *pbVar20 = bVar22;
      bVar4 = (byte)uVar28;
      bVar10 = (byte)(uVar28 >> 8);
      bVar14 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar23 = (byte)(uVar28 >> 0x28);
      bVar11 = (byte)(uVar28 >> 0x30);
      bVar2 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar20[1] = bVar11;
        pbVar20[2] = bVar23;
        pbVar20[3] = bVar12;
        pbVar20[4] = bVar14;
        pbVar20[5] = bVar2;
        pbVar20[6] = bVar10;
        pbVar20[7] = bVar4;
        pbVar20 = pbVar20 + 8;
      }
      else {
        pbVar20[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar17 = pbVar20 + 1;
        if (bVar22 == 0xff) {
          pbVar17 = pbVar20 + 2;
        }
        pbVar20[uVar26 + 1] = bVar11;
        pbVar20[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar32 = (uVar26 & 0xff000000000000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar23;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar26 & 0xff0000000000) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar12;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        bVar32 = (uVar26 & 0xff00000000) == 0;
        *pbVar27 = 0;
        pbVar20[(ulong)bVar32 + 1] = bVar14;
        pbVar20[(ulong)bVar32 + 2] = 0;
        uVar6 = (uint)uVar28 & 0xff000000;
        pbVar17 = pbVar20 + (ulong)bVar32 + 2;
        if (uVar6 == 0xff000000) {
          pbVar17 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar17 = bVar2;
        pbVar27 = pbVar20 + (ulong)bVar32 + 4;
        if (uVar6 != 0xff000000) {
          pbVar27 = pbVar20 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        uVar6 = ~(uint)uVar28;
        bVar32 = (uVar6 & 0xff0000) == 0;
        pbVar17[(ulong)bVar32 + 1] = bVar10;
        pbVar17[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar6 & 0xff00) == 0;
        pbVar20 = pbVar17 + (ulong)bVar32 + 2;
        if (bVar33) {
          pbVar20 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar20 = bVar4;
        pbVar27 = pbVar17 + (ulong)bVar32 + 4;
        if (!bVar33) {
          pbVar27 = pbVar17 + (ulong)bVar32 + 3;
        }
        *pbVar27 = 0;
        pbVar20 = pbVar20 + (ulong)(bVar4 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      aVar9 = (anon_union_8_2_c960f3a9_for_put_buffer)(long)(int)uVar29;
    }
    else {
      aVar9.c = (long)(int)uVar29 | uVar28 << ((byte)iVar13 & 0x3f);
    }
  }
  (state->cur).put_buffer = aVar9;
  (state->cur).free_bits = iVar5;
  if (uVar18 < 0x200) {
    __src = _buffer;
    for (uVar18 = (long)pbVar20 - (long)__src; uVar18 != 0; uVar18 = uVar18 - uVar28) {
      uVar28 = state->free_in_buffer;
      if (uVar18 < state->free_in_buffer) {
        uVar28 = uVar18;
      }
      memcpy(state->next_output_byte,__src,uVar28);
      state->next_output_byte = state->next_output_byte + uVar28;
      psVar1 = &state->free_in_buffer;
      *psVar1 = *psVar1 - uVar28;
      if ((*psVar1 == 0) && (bVar7 = dump_buffer(state), bVar7 == 0)) {
        return 0;
      }
      __src = __src + uVar28;
    }
  }
  else {
    state->free_in_buffer =
         (size_t)(state->next_output_byte + (state->free_in_buffer - (long)pbVar20));
    state->next_output_byte = pbVar20;
  }
  return 1;
}

Assistant:

LOCAL(boolean)
encode_one_block(working_state *state, JCOEFPTR block, int last_dc_val,
                 c_derived_tbl *dctbl, c_derived_tbl *actbl)
{
  int temp, nbits, free_bits;
  bit_buf_type put_buffer;
  JOCTET _buffer[BUFSIZE], *buffer;
  int localbuf = 0;

  free_bits = state->cur.free_bits;
  put_buffer = state->cur.put_buffer.c;
  LOAD_BUFFER()

  /* Encode the DC coefficient difference per section F.1.2.1 */

  temp = block[0] - last_dc_val;

  /* This is a well-known technique for obtaining the absolute value without a
   * branch.  It is derived from an assembly language technique presented in
   * "How to Optimize for the Pentium Processors", Copyright (c) 1996, 1997 by
   * Agner Fog.  This code assumes we are on a two's complement machine.
   */
  nbits = temp >> (CHAR_BIT * sizeof(int) - 1);
  temp += nbits;
  nbits ^= temp;

  /* Find the number of bits needed for the magnitude of the coefficient */
  nbits = JPEG_NBITS(nbits);

  /* Emit the Huffman-coded symbol for the number of bits.
   * Emit that number of bits of the value, if positive,
   * or the complement of its magnitude, if negative.
   */
  PUT_CODE(dctbl->ehufco[nbits], dctbl->ehufsi[nbits])

  /* Encode the AC coefficients per section F.1.2.2 */

  {
    int r = 0;                  /* r = run length of zeros */

/* Manually unroll the k loop to eliminate the counter variable.  This
 * improves performance greatly on systems with a limited number of
 * registers (such as x86.)
 */
#define kloop(jpeg_natural_order_of_k) { \
  if ((temp = block[jpeg_natural_order_of_k]) == 0) { \
    r += 16; \
  } else { \
    /* Branch-less absolute value, bitwise complement, etc., same as above */ \
    nbits = temp >> (CHAR_BIT * sizeof(int) - 1); \
    temp += nbits; \
    nbits ^= temp; \
    nbits = JPEG_NBITS_NONZERO(nbits); \
    /* if run length > 15, must emit special run-length-16 codes (0xF0) */ \
    while (r >= 16 * 16) { \
      r -= 16 * 16; \
      PUT_BITS(actbl->ehufco[0xf0], actbl->ehufsi[0xf0]) \
    } \
    /* Emit Huffman symbol for run length / number of bits */ \
    r += nbits; \
    PUT_CODE(actbl->ehufco[r], actbl->ehufsi[r]) \
    r = 0; \
  } \
}